

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::xml_document::save
          (xml_document *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  size_t __n;
  void *__buf;
  undefined1 local_2840 [8];
  xml_buffered_writer buffered_writer;
  xml_encoding encoding_local;
  uint flags_local;
  char_t *indent_local;
  xml_writer *writer_local;
  xml_document *this_local;
  
  __n = CONCAT44(in_register_0000000c,flags);
  buffered_writer.encoding = encoding;
  buffered_writer._10260_4_ = flags;
  impl::anon_unknown_0::xml_buffered_writer::xml_buffered_writer
            ((xml_buffered_writer *)local_2840,writer,encoding);
  if (((buffered_writer._10260_4_ & 2) != 0) && (buffered_writer.encoding != encoding_latin1)) {
    __n = 0xbf;
    impl::anon_unknown_0::xml_buffered_writer::write
              ((xml_buffered_writer *)local_2840,0xef,(void *)0xbb,0xbf);
  }
  if (((buffered_writer._10260_4_ & 8) == 0) &&
     (bVar1 = impl::anon_unknown_0::has_declaration((this->super_xml_node)._root), !bVar1)) {
    impl::anon_unknown_0::xml_buffered_writer::write_string
              ((xml_buffered_writer *)local_2840,(char_t *)"<?xml version=\"1.0\"");
    if (buffered_writer.encoding == encoding_latin1) {
      impl::anon_unknown_0::xml_buffered_writer::write_string
                ((xml_buffered_writer *)local_2840,(char_t *)" encoding=\"ISO-8859-1\"");
    }
    impl::anon_unknown_0::xml_buffered_writer::write
              ((xml_buffered_writer *)local_2840,0x3f,(void *)0x3e,__n);
    if ((buffered_writer._10260_4_ & 4) == 0) {
      impl::anon_unknown_0::xml_buffered_writer::write
                ((xml_buffered_writer *)local_2840,10,__buf,__n);
    }
  }
  impl::anon_unknown_0::node_output
            ((xml_buffered_writer *)local_2840,(this->super_xml_node)._root,indent,
             buffered_writer._10260_4_,0);
  impl::anon_unknown_0::xml_buffered_writer::flush((xml_buffered_writer *)local_2840);
  return;
}

Assistant:

PUGI__FN void xml_document::save(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		impl::xml_buffered_writer buffered_writer(writer, encoding);

		if ((flags & format_write_bom) && encoding != encoding_latin1)
		{
			// BOM always represents the codepoint U+FEFF, so just write it in native encoding
		#ifdef PUGIXML_WCHAR_MODE
			unsigned int bom = 0xfeff;
			buffered_writer.write(static_cast<wchar_t>(bom));
		#else
			buffered_writer.write('\xef', '\xbb', '\xbf');
		#endif
		}

		if (!(flags & format_no_declaration) && !impl::has_declaration(_root))
		{
			buffered_writer.write_string(PUGIXML_TEXT("<?xml version=\"1.0\""));
			if (encoding == encoding_latin1) buffered_writer.write_string(PUGIXML_TEXT(" encoding=\"ISO-8859-1\""));
			buffered_writer.write('?', '>');
			if (!(flags & format_raw)) buffered_writer.write('\n');
		}

		impl::node_output(buffered_writer, _root, indent, flags, 0);

		buffered_writer.flush();
	}